

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  DTableDesc DVar1;
  undefined8 in_RCX;
  int flags_00;
  HUF_DTable *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  HUF_DTable *in_R8;
  size_t unaff_retaddr;
  DTableDesc dtd;
  undefined8 local_38;
  undefined1 uStack_2f;
  
  flags_00 = (int)((ulong)in_RCX >> 0x20);
  DVar1 = HUF_getDTableDesc(in_R8);
  uStack_2f = DVar1.tableType;
  if (uStack_2f == '\0') {
    local_38 = HUF_decompress4X1_usingDTable_internal
                         ((void *)CONCAT44(flags,dtd),unaff_retaddr,in_RDI,in_RSI,in_RDX,flags_00);
  }
  else {
    local_38 = HUF_decompress4X2_usingDTable_internal
                         ((void *)CONCAT44(flags,dtd),unaff_retaddr,in_RDI,in_RSI,in_RDX,flags_00);
  }
  return local_38;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}